

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any.h
# Opt level: O1

void UnitTests::stream_any_details::output_range_or_type<char*>
               (ostream *s,char **t,false_type *param_3)

{
  char *__s;
  size_t sVar1;
  
  __s = *t;
  if (__s != (char *)0x0) {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(s,__s,sVar1);
    return;
  }
  std::ios::clear((int)s + (int)*(undefined8 *)(*(long *)s + -0x18));
  return;
}

Assistant:

void output_range_or_type(std::ostream& s, const T& t, const std::false_type& /*unused*/)
        {
            output(s, t, is_streamable<T>{});
        }